

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr finish_parse_trap(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  trap_kind_conflict *ptVar3;
  void *pvVar4;
  undefined8 *puVar5;
  long lVar6;
  uint16_t uVar7;
  long lVar8;
  undefined8 *puVar9;
  bitflag *pbVar10;
  ulong uVar11;
  byte bVar12;
  
  bVar12 = 0;
  z_info->trap_max = 0;
  pvVar4 = parser_priv(p);
  if (pvVar4 != (void *)0x0) {
    uVar7 = z_info->trap_max;
    do {
      uVar7 = uVar7 + 1;
      pvVar4 = *(void **)((long)pvVar4 + 0x38);
    } while (pvVar4 != (void *)0x0);
    z_info->trap_max = uVar7;
  }
  trap_info = (trap_kind_conflict *)mem_zalloc((ulong)z_info->trap_max * 0x80 + 0x80);
  uVar1 = z_info->trap_max;
  puVar5 = (undefined8 *)parser_priv(p);
  if (puVar5 != (undefined8 *)0x0) {
    lVar8 = (ulong)uVar1 << 7;
    uVar11 = (ulong)uVar1;
    do {
      if ((long)uVar11 < 1) {
        __assert_fail("tidx >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/init.c"
                      ,0x79f,"errr finish_parse_trap(struct parser *)");
      }
      puVar9 = puVar5;
      pbVar10 = trap_info[-1].flags + lVar8 + -0x68;
      for (lVar6 = 0x10; ptVar3 = trap_info, lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined8 *)pbVar10 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
        pbVar10 = pbVar10 + ((ulong)bVar12 * -2 + 1) * 8;
      }
      pbVar10 = trap_info->flags;
      *(int *)((long)trap_info + lVar8 + -0x40) = (int)(uVar11 - 1);
      pbVar10 = pbVar10 + lVar8 + -0x68;
      if ((long)(ulong)z_info->trap_max <= (long)uVar11) {
        pbVar10 = (bitflag *)0x0;
      }
      *(bitflag **)((long)ptVar3 + lVar8 + -0x48) = pbVar10;
      puVar5 = (undefined8 *)puVar5[7];
      lVar8 = lVar8 + -0x80;
      uVar11 = uVar11 - 1;
    } while (puVar5 != (undefined8 *)0x0);
  }
  pvVar4 = parser_priv(p);
  while (pvVar4 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar4 + 0x38);
    mem_free(pvVar4);
    pvVar4 = pvVar2;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_trap(struct parser *p) {
	struct trap_kind *t, *n;
	int tidx;

	/* Scan the list for the max id */
	z_info->trap_max = 0;
	t = parser_priv(p);
	while (t) {
		z_info->trap_max++;
		t = t->next;
	}

	trap_info = mem_zalloc((z_info->trap_max + 1) * sizeof(*t));
	tidx = z_info->trap_max - 1;
    for (t = parser_priv(p); t; t = t->next, tidx--) {
		assert(tidx >= 0);

		memcpy(&trap_info[tidx], t, sizeof(*t));
		trap_info[tidx].tidx = tidx;
		if (tidx < z_info->trap_max - 1)
			trap_info[tidx].next = &trap_info[tidx + 1];
		else
			trap_info[tidx].next = NULL;
    }

    t = parser_priv(p);
    while (t) {
		n = t->next;
		mem_free(t);
		t = n;
    }

    parser_destroy(p);
    return 0;
}